

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v7::detail::count_digits<4u,fmt::v7::detail::fallback_uintptr>(fallback_uintptr n)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  fallback_uintptr n_local;
  
  n_local = n;
  uVar1 = 7;
  iVar3 = 0xe;
  do {
    if (iVar3 == 0) {
      iVar3 = 0;
LAB_00322d79:
      iVar2 = count_digits<4u,unsigned_int>(n.value._0_4_ & 0xff);
      return iVar2 + iVar3;
    }
    if (n_local.value[uVar1] != 0) {
      n.value[1] = '\0';
      n.value[2] = '\0';
      n.value[3] = '\0';
      n.value[4] = '\0';
      n.value[5] = '\0';
      n.value[6] = '\0';
      n.value[7] = '\0';
      n.value[0] = n_local.value[uVar1];
      goto LAB_00322d79;
    }
    uVar1 = uVar1 - 1;
    iVar3 = iVar3 + -2;
  } while( true );
}

Assistant:

FMT_FUNC int count_digits<4>(detail::fallback_uintptr n) {
  // fallback_uintptr is always stored in little endian.
  int i = static_cast<int>(sizeof(void*)) - 1;
  while (i > 0 && n.value[i] == 0) --i;
  auto char_digits = std::numeric_limits<unsigned char>::digits / 4;
  return i >= 0 ? i * char_digits + count_digits<4, unsigned>(n.value[i]) : 1;
}